

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int ellswift_xdh_hash_function_prefix
              (uchar *output,uchar *x32,uchar *ell_a64,uchar *ell_b64,void *data)

{
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  secp256k1_sha256_write(&local_98,(uchar *)data,0x40);
  secp256k1_sha256_write(&local_98,ell_a64,0x40);
  secp256k1_sha256_write(&local_98,ell_b64,0x40);
  secp256k1_sha256_write(&local_98,x32,0x20);
  secp256k1_sha256_finalize(&local_98,output);
  return 1;
}

Assistant:

static int ellswift_xdh_hash_function_prefix(unsigned char *output, const unsigned char *x32, const unsigned char *ell_a64, const unsigned char *ell_b64, void *data) {
    secp256k1_sha256 sha;

    secp256k1_sha256_initialize(&sha);
    secp256k1_sha256_write(&sha, data, 64);
    secp256k1_sha256_write(&sha, ell_a64, 64);
    secp256k1_sha256_write(&sha, ell_b64, 64);
    secp256k1_sha256_write(&sha, x32, 32);
    secp256k1_sha256_finalize(&sha, output);
    secp256k1_sha256_clear(&sha);

    return 1;
}